

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::TaggedPattern::evalImpl
          (TaggedPattern *this,EvalContext *context,ConstantValue *value,
          CaseStatementCondition conditionKind)

{
  bool bVar1;
  __optional_ne_t<unsigned_int,_unsigned_int> _Var2;
  ConstantValue *in_RDX;
  long in_RSI;
  Pattern *in_RDI;
  Union *unionVal;
  SVInt *in_stack_ffffffffffffff68;
  SVInt *pSVar3;
  ConstantValue *in_stack_ffffffffffffff70;
  CaseStatementCondition conditionKind_00;
  undefined8 in_stack_ffffffffffffff78;
  bitwidth_t bits;
  EvalContext *in_stack_ffffffffffffff80;
  Pattern *this_00;
  SVInt local_60 [2];
  SVInt local_40;
  Union *local_30;
  ConstantValue *local_18;
  
  bits = (bitwidth_t)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  this_00 = in_RDI;
  local_18 = in_RDX;
  bVar1 = slang::ConstantValue::bad((ConstantValue *)0x9eb29d);
  if (bVar1) {
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    local_30 = slang::ConstantValue::unionVal((ConstantValue *)0x9eb2c0);
    CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0x9eb2cf);
    _Var2 = std::operator!=((optional<unsigned_int> *)in_stack_ffffffffffffff70,
                            (uint *)in_stack_ffffffffffffff68);
    if (_Var2) {
      pSVar3 = &local_40;
      SVInt::SVInt(pSVar3,bits,(uint64_t)in_stack_ffffffffffffff70,
                   SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
      slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      SVInt::~SVInt(pSVar3);
    }
    else if (*(long *)(in_RSI + 0x28) == 0) {
      pSVar3 = local_60;
      SVInt::SVInt((SVInt *)in_stack_ffffffffffffff80,bits,(uint64_t)in_stack_ffffffffffffff70,
                   SUB81((ulong)pSVar3 >> 0x38,0));
      slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff70,pSVar3);
      SVInt::~SVInt((SVInt *)in_stack_ffffffffffffff80);
    }
    else {
      conditionKind_00 = (CaseStatementCondition)((ulong)*(undefined8 *)(in_RSI + 0x28) >> 0x20);
      CopyPtr<slang::SVUnion>::operator->((CopyPtr<slang::SVUnion> *)0x9eb377);
      Pattern::eval(this_00,in_stack_ffffffffffffff80,local_18,conditionKind_00);
    }
  }
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue TaggedPattern::evalImpl(EvalContext& context, const ConstantValue& value,
                                      CaseStatementCondition conditionKind) const {
    if (value.bad())
        return nullptr;

    // Check if the union's active member matches the one in our pattern.
    auto& unionVal = value.unionVal();
    if (unionVal->activeMember != member.fieldIndex)
        return SVInt(1, 0, false);

    if (valuePattern)
        return valuePattern->eval(context, unionVal->value, conditionKind);

    // If no nested pattern we just succeed.
    return SVInt(1, 1, false);
}